

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  type *ptVar2;
  uint uVar3;
  double dVar4;
  int iVar5;
  char *pcVar6;
  typed_value<bool,_char> *ptVar7;
  typed_value<unsigned_int,_char> *ptVar8;
  typed_value<pgi::PolicyInitialization,_char> *ptVar9;
  typed_value<unsigned_long,_char> *ptVar10;
  typed_value<int,_char> *ptVar11;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar12;
  options_description *poVar13;
  basic_command_line_parser<char> *this;
  size_type sVar14;
  any *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  bool *pbVar17;
  ostream *poVar18;
  uint *puVar19;
  joint_vertex_t qstart;
  long lVar20;
  long lVar21;
  DiscreteSpace<pgi::DiscreteAction> *d;
  DiscreteSpace<pgi::DiscreteObservation> *d_00;
  DiscreteSpace<pgi::DiscreteAction> *d_01;
  DiscreteSpace<pgi::DiscreteObservation> *d_02;
  PolicyGraph *g;
  uint uVar22;
  ulong uVar23;
  double local_1b30;
  MADPDecPOMDPDiscrete local_1b28;
  allocator local_1b19;
  long local_1b18;
  long local_1b10;
  ulong local_1b08;
  _Head_base<0UL,_pgi::ObservationInterface_*,_false> local_1b00;
  __uniq_ptr_impl<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
  local_1af8;
  PolicyInitialization policy_initialization;
  int improvement_steps;
  long *local_1ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae0;
  uint width;
  uint rng_seed;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_policy_graphs;
  belief_t initial_belief;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a80;
  long local_1a60;
  size_t max_history_cache_size;
  size_t blind_policy_initial_joint_action;
  uint horizon;
  string local_1a40;
  __shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
  local_1a20;
  vector<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_> local_1a10;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_19e8 [144];
  BackPassProperties local_1958;
  ImprovementResult bp;
  positional_options_description pp;
  DecPOMDPDiscrete decpomdp;
  string local_1798;
  allocator local_1778 [32];
  JointPolicy jp;
  ofstream fvalue;
  HistoryCache cache;
  HistoryData local_1450;
  options_description cmdline_options;
  options_description hidden;
  options_description config;
  JointObservationSpace local_12a8;
  JointActionSpace local_1250;
  ofstream fs;
  ofstream ftime;
  ostringstream ss_1;
  PRNG rng;
  ostringstream ss;
  JointPolicy local_b8;
  
  std::__cxx11::string::string((string *)&ftime,*argv,(allocator *)&fs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fvalue,
                 "NPGI planner for (Dec)POMDPs \nUsage: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftime);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rng,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fvalue,
                 " [OPTION]... [DPOMDP-FILE]\nOptions");
  uVar3 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar22 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&config,(string *)&rng,
             (uint)boost::program_options::options_description::m_default_line_length,uVar22);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::~string((string *)&fvalue);
  std::__cxx11::string::~string((string *)&ftime);
  _fvalue = (pointer)boost::program_options::options_description::add_options();
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&fvalue,"help");
  ptVar7 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  jp.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb._0_1_ = 0;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)&jp);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"verbose,v",(char *)ptVar7);
  ptVar8 = boost::program_options::value<unsigned_int>(&horizon);
  _ss_1 = 3;
  ptVar8 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar8,(uint *)&ss_1);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"horizon,h",(char *)ptVar8);
  ptVar8 = boost::program_options::value<unsigned_int>(&width);
  _ss = 3;
  ptVar8 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar8,(uint *)&ss);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"policy-width,w",(char *)ptVar8);
  ptVar9 = boost::program_options::value<pgi::PolicyInitialization>(&policy_initialization);
  decpomdp.s_.v_.super__Vector_base<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_>._M_impl
  .super__Vector_impl_data._M_start._0_4_ = 0;
  ptVar9 = boost::program_options::typed_value<pgi::PolicyInitialization,_char>::default_value
                     (ptVar9,(PolicyInitialization *)&decpomdp);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"policy-initialization,p",(char *)ptVar9);
  ptVar10 = boost::program_options::value<unsigned_long>(&blind_policy_initial_joint_action);
  _ftime = (pointer)0x0;
  ptVar10 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar10,(unsigned_long *)&ftime);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"blind-action,b",(char *)ptVar10);
  ptVar11 = boost::program_options::value<int>(&improvement_steps);
  _vm = 9;
  ptVar11 = boost::program_options::typed_value<int,_char>::default_value(ptVar11,(int *)&vm);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"improvement-steps,i",(char *)ptVar11);
  ptVar7 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  hidden = (options_description)0x0;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)&hidden);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"use-lower-bound,l",(char *)ptVar7);
  ptVar7 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  cmdline_options = (options_description)0x0;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value
                     (ptVar7,(bool *)&cmdline_options);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"use-entropy-reward,e",(char *)ptVar7);
  ptVar7 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  cache.max_size_._0_1_ = 0;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)&cache);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"use-sparse,t",(char *)ptVar7);
  ptVar8 = boost::program_options::value<unsigned_int>(&rng_seed);
  bp.improved_policy.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb._0_4_ =
       0x499602d2;
  ptVar8 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar8,(uint *)&bp);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"seed,s",(char *)ptVar8);
  ptVar12 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&rng,"./",(allocator *)&pp);
  ptVar12 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&rng);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"output-prefix,o",(char *)ptVar12);
  ptVar10 = boost::program_options::value<unsigned_long>(&max_history_cache_size);
  _fs = (pointer)0x2faf080;
  ptVar10 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar10,(unsigned_long *)&fs);
  boost::program_options::options_description_easy_init::operator()
            (pcVar6,(value_semantic *)"max-cache-size,m",(char *)ptVar10);
  std::__cxx11::string::~string((string *)&rng);
  boost::program_options::positional_options_description::positional_options_description(&pp);
  boost::program_options::positional_options_description::add((char *)&pp,0x19d2b6);
  std::__cxx11::string::string((string *)&rng,"Hidden options",(allocator *)&fvalue);
  boost::program_options::options_description::options_description
            (&hidden,(string *)&rng,uVar3,uVar22);
  std::__cxx11::string::~string((string *)&rng);
  rng.engine_.x._0_8_ = boost::program_options::options_description::add_options();
  ptVar12 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&rng,(value_semantic *)"dpomdp-file",(char *)ptVar12);
  boost::program_options::options_description::options_description(&cmdline_options,uVar3,uVar22);
  poVar13 = (options_description *)
            boost::program_options::options_description::add(&cmdline_options);
  boost::program_options::options_description::add(poVar13);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&rng,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&rng,&cmdline_options);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&fvalue,this);
  boost::program_options::store((basic_parsed_options *)&fvalue,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&fvalue);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&rng);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&rng,"help",(allocator *)&fvalue);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_19e8,(key_type *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  if ((argc == 1) || (sVar14 != 0)) {
    poVar18 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&config);
  }
  else {
    std::__cxx11::string::string((string *)&rng,"dpomdp-file",(allocator *)&fvalue);
    sVar14 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_19e8,(key_type *)&rng);
    std::__cxx11::string::~string((string *)&rng);
    if (sVar14 != 0) {
      std::__cxx11::string::string((string *)&rng,"dpomdp-file",(allocator *)&fvalue);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      pgi::madpwrapper::MADPDecPOMDPDiscrete::MADPDecPOMDPDiscrete(&local_1b28,pbVar16);
      std::__cxx11::string::~string((string *)&rng);
      std::__cxx11::string::string((string *)&rng,"verbose",(allocator *)&fvalue);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      bVar1 = *pbVar17;
      std::__cxx11::string::~string((string *)&rng);
      if (bVar1 == true) {
        poVar18 = std::operator<<((ostream *)&std::cout,"Loaded problem file ");
        std::__cxx11::string::string((string *)&rng,"dpomdp-file",(allocator *)&fvalue);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        poVar18 = std::operator<<(poVar18,(string *)pbVar16);
        std::endl<char,std::char_traits<char>>(poVar18);
        std::__cxx11::string::~string((string *)&rng);
      }
      pgi::make_state_space((StateSpace *)&local_1a10,&local_1b28);
      pgi::make_joint_action_space(&local_1250,&local_1b28);
      pgi::make_joint_observation_space(&local_12a8,&local_1b28);
      std::__cxx11::string::string((string *)&rng,"use-sparse",(allocator *)&fs);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      pgi::make_transition_matrix((pgi *)&local_1af8,&local_1b28,*pbVar17);
      std::__cxx11::string::string((string *)&fvalue,"use-sparse",(allocator *)&ss_1);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      pgi::make_observation_matrix((pgi *)&local_1b00,&local_1b28,*pbVar17);
      std::__cxx11::string::string((string *)&ftime,"use-entropy-reward",(allocator *)&ss);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      pgi::make_reward_matrix((pgi *)&local_1ae8,&local_1b28,*pbVar17);
      pgi::DecPOMDPDiscrete::DecPOMDPDiscrete
                (&decpomdp,(StateSpace *)&local_1a10,&local_1250,&local_12a8,
                 (unique_ptr<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
                  *)&local_1af8,
                 (unique_ptr<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
                  *)&local_1b00,
                 (unique_ptr<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_> *)
                 &local_1ae8);
      if (local_1ae8 != (long *)0x0) {
        (**(code **)(*local_1ae8 + 8))();
      }
      local_1ae8 = (long *)0x0;
      std::__cxx11::string::~string((string *)&ftime);
      if (local_1b00._M_head_impl != (ObservationInterface *)0x0) {
        (*(local_1b00._M_head_impl)->_vptr_ObservationInterface[1])();
      }
      local_1b00._M_head_impl = (ObservationInterface *)0x0;
      std::__cxx11::string::~string((string *)&fvalue);
      if (local_1af8._M_t.
          super__Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
          .super__Head_base<0UL,_pgi::StateTransitionInterface_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
           )0x0) {
        (*(*(_func_int ***)
            local_1af8._M_t.
            super__Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
            .super__Head_base<0UL,_pgi::StateTransitionInterface_*,_false>._M_head_impl)[1])();
      }
      local_1af8._M_t.
      super__Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
      .super__Head_base<0UL,_pgi::StateTransitionInterface_*,_false>._M_head_impl =
           (tuple<pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
            )(_Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
              )0x0;
      std::__cxx11::string::~string((string *)&rng);
      pgi::JointDiscreteSpace<pgi::DiscreteObservation>::~JointDiscreteSpace(&local_12a8);
      pgi::JointDiscreteSpace<pgi::DiscreteAction>::~JointDiscreteSpace(&local_1250);
      std::vector<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_>::~vector(&local_1a10);
      std::__cxx11::string::string((string *)&rng,"use-sparse",(allocator *)&fvalue);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      pgi::make_initial_belief((pgi *)&initial_belief,&local_1b28,*pbVar17);
      std::__cxx11::string::~string((string *)&rng);
      pgi::PRNG::PRNG(&rng,rng_seed);
      local_policy_graphs.
      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_policy_graphs.
      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_policy_graphs.
      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar23 = 0;
          uVar23 < (ulong)(((long)decpomdp.jas_.local_.
                                  super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)decpomdp.jas_.local_.
                                 super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar23 = uVar23 + 1) {
        std::__cxx11::string::string((string *)&ftime,"horizon",(allocator *)&fs);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        puVar19 = boost::any_cast<unsigned_int_const&>(paVar15);
        pgi::fixed_width((PolicyGraph *)&fvalue,*puVar19,(ulong)width,
                         decpomdp.jas_.super_IndexSpace<unsigned_long>.num_elements_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar23],
                         decpomdp.jos_.super_IndexSpace<unsigned_long>.num_elements_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar23]);
        std::
        vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
        ::
        emplace_back<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>
                  ((vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
                    *)&local_policy_graphs,(PolicyGraph *)&fvalue);
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
        ::~adjacency_list((PolicyGraph *)&fvalue);
        std::__cxx11::string::~string((string *)&ftime);
      }
      if (policy_initialization == random) {
        pgi::set_random(&local_policy_graphs,&rng);
      }
      else if (policy_initialization == greedy) {
        std::
        __shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_1a20,
                       (__shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
                        *)&initial_belief);
        pgi::set_open_loop_greedy(&local_policy_graphs,(belief_t *)&local_1a20,&decpomdp);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a20._M_refcount);
      }
      else if (policy_initialization == blind) {
        pgi::set_random(&local_policy_graphs,&rng);
        pgi::set_blind(&local_policy_graphs,blind_policy_initial_joint_action,&decpomdp.jas_);
      }
      std::__cxx11::string::string((string *)&fvalue,"verbose",(allocator *)&ftime);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      bVar1 = *pbVar17;
      std::__cxx11::string::~string((string *)&fvalue);
      if (bVar1 == true) {
        poVar18 = std::operator<<((ostream *)&std::cout,"Initialized policy using ");
        poVar18 = pgi::operator<<(poVar18,&policy_initialization);
        poVar18 = std::operator<<(poVar18," strategy");
        std::endl<char,std::char_traits<char>>(poVar18);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::__cxx11::string::string((string *)&fvalue,"output-prefix",(allocator *)&ftime);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      poVar18 = std::operator<<((ostream *)&ss,(string *)pbVar16);
      poVar18 = std::operator<<(poVar18,"step");
      *(undefined8 *)(poVar18 + *(long *)(*(long *)poVar18 + -0x18) + 0x10) = 3;
      poVar18 = std::operator<<(poVar18);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,0);
      std::operator<<(poVar18,"_");
      std::__cxx11::string::~string((string *)&fvalue);
      std::__cxx11::stringbuf::str();
      write_policy_to_file(&local_policy_graphs,(string *)&fvalue,&decpomdp);
      std::__cxx11::string::~string((string *)&fvalue);
      std::__cxx11::string::string((string *)&fs,"output-prefix",(allocator *)&ss_1);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftime,
                     pbVar16,"policy_values.txt");
      std::ofstream::ofstream(&fvalue,(string *)&ftime,_S_out);
      std::__cxx11::string::~string((string *)&ftime);
      std::__cxx11::string::~string((string *)&fs);
      std::__cxx11::string::string((string *)&ss_1,"output-prefix",(allocator *)&bp);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs,
                     pbVar16,"duration_microseconds.txt");
      std::ofstream::ofstream(&ftime,(string *)&fs,_S_out);
      std::__cxx11::string::~string((string *)&fs);
      std::__cxx11::string::~string((string *)&ss_1);
      local_1450.probability_ = 1.0;
      local_1450.last_observation_probability_ = 0.0;
      local_1450.sum_of_expected_rewards_ = 0.0;
      local_1450.belief_.self_.
      super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = initial_belief.self_.
                super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_1450.belief_.self_.
      super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           initial_belief.self_.
           super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      initial_belief.self_.
      super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      initial_belief.self_.
      super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::TreeCache
                (&cache,&local_1450,max_history_cache_size);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1450.belief_.self_.
                  super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      pgi::JointPolicy::JointPolicy(&jp,&local_policy_graphs);
      qstart = pgi::JointPolicy::root(&jp);
      _fs = (pointer)0x0;
      local_1b30 = pgi::value(&jp,qstart,(History *)&fs,&decpomdp,&cache);
      std::_Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::
      ~_Vector_base((_Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_> *
                    )&fs);
      poVar18 = std::ostream::_M_insert<double>(local_1b30);
      std::endl<char,std::char_traits<char>>(poVar18);
      std::operator<<((ostream *)&std::cout,"Policy value: ");
      poVar18 = std::ostream::_M_insert<double>(local_1b30);
      std::endl<char,std::char_traits<char>>(poVar18);
      poVar18 = std::operator<<((ostream *)&std::cout,"Stored ");
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      poVar18 = std::operator<<(poVar18," histories in cache");
      std::endl<char,std::char_traits<char>>(poVar18);
      local_1b18 = 0;
      local_1b10 = 0;
      local_1b08 = 0;
      while( true ) {
        if ((ulong)(((long)decpomdp.jas_.local_.
                           super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)decpomdp.jas_.local_.
                          super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= local_1b08) break;
        std::__cxx11::string::string((string *)&local_1a80,"output-prefix",local_1778);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        lVar20 = local_1b10;
        pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        std::operator+(&local_1ae0,pbVar16,"best_policy_agent");
        std::__cxx11::to_string(&local_1a40,local_1b08);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bp,
                       &local_1ae0,&local_1a40);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bp,
                       ".dot");
        std::ofstream::ofstream(&fs,(string *)&ss_1,_S_out);
        std::__cxx11::string::~string((string *)&ss_1);
        std::__cxx11::string::~string((string *)&bp);
        std::__cxx11::string::~string((string *)&local_1a40);
        std::__cxx11::string::~string((string *)&local_1ae0);
        std::__cxx11::string::~string((string *)&local_1a80);
        g = (PolicyGraph *)
            ((long)&((jp.locals_.
                      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_type).m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next + local_1b18);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ss_1,(pgi *)((long)&((decpomdp.jas_.local_.
                                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->v_).
                                           super__Vector_base<pgi::DiscreteAction,_std::allocator<pgi::DiscreteAction>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar20),d);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&bp,(pgi *)((long)&((decpomdp.jos_.local_.
                                           super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->v_).
                                         super__Vector_base<pgi::DiscreteObservation,_std::allocator<pgi::DiscreteObservation>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar20),d_00);
        pgi::print((ostream *)&fs,g,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ss_1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&bp);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&bp);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ss_1);
        std::ofstream::~ofstream((ostream *)&fs);
        local_1b08 = local_1b08 + 1;
        local_1b10 = local_1b10 + 0x18;
        local_1b18 = local_1b18 + 0x38;
      }
      std::__cxx11::string::string((string *)&bp,"output-prefix",(allocator *)&local_1ae0);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_1,
                     pbVar16,"best_value.txt");
      std::ofstream::ofstream(&fs,(string *)&ss_1,_S_out);
      std::__cxx11::string::~string((string *)&ss_1);
      std::__cxx11::string::~string((string *)&bp);
      poVar18 = std::ostream::_M_insert<double>(local_1b30);
      std::endl<char,std::char_traits<char>>(poVar18);
      iVar5 = 1;
      while (local_1b18 = CONCAT44(local_1b18._4_4_,iVar5), iVar5 <= improvement_steps) {
        lVar20 = std::chrono::_V2::system_clock::now();
        std::__cxx11::string::string((string *)&ss_1,"use-lower-bound",(allocator *)&bp);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar17 = boost::any_cast<bool_const&>(paVar15);
        local_1958.use_lower_bound = *pbVar17;
        local_1958.prob_heuristic_improvement = 0.5;
        local_1958.prob_random_history_in_heuristic_improvement = 0.9;
        std::__cxx11::string::~string((string *)&ss_1);
        pgi::JointPolicy::JointPolicy(&local_b8,&jp);
        pgi::backpass::improve(&bp,&local_b8,&decpomdp,&cache,&rng,&local_1958);
        pgi::JointPolicy::~JointPolicy(&local_b8);
        lVar21 = std::chrono::_V2::system_clock::now();
        local_1a60 = (lVar21 - lVar20) / 1000;
        poVar18 = std::ostream::_M_insert<long>((long)&ftime);
        std::endl<char,std::char_traits<char>>(poVar18);
        poVar18 = std::ostream::_M_insert<double>(bp.improved_policy_value);
        std::endl<char,std::char_traits<char>>(poVar18);
        dVar4 = bp.improved_policy_value;
        if (local_1b30 < bp.improved_policy_value) {
          pgi::JointPolicy::operator=(&jp,&bp.improved_policy);
          local_1b30 = 0.0;
          local_1b10 = 0;
          local_1b08 = 0;
          while( true ) {
            if ((ulong)(((long)decpomdp.jas_.local_.
                               super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)decpomdp.jas_.local_.
                              super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= local_1b08)
            break;
            std::__cxx11::string::string((string *)local_1778,"output-prefix",&local_1b19);
            paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]
                                       ((string *)&vm);
            pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
            std::operator+(&local_1a40,pbVar16,"best_policy_agent");
            std::__cxx11::to_string(&local_1798,local_1b08);
            std::operator+(&local_1a80,&local_1a40,&local_1798);
            std::operator+(&local_1ae0,&local_1a80,".dot");
            std::ofstream::ofstream((string *)&ss_1,(string *)&local_1ae0,_S_out);
            std::__cxx11::string::~string((string *)&local_1ae0);
            std::__cxx11::string::~string((string *)&local_1a80);
            std::__cxx11::string::~string((string *)&local_1798);
            std::__cxx11::string::~string((string *)&local_1a40);
            std::__cxx11::string::~string((string *)local_1778);
            lVar20 = local_1b10;
            ptVar2 = &(jp.locals_.
                       super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_type;
            pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1ae0,
                       (pgi *)((long)&((decpomdp.jas_.local_.
                                        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->v_).
                                      super__Vector_base<pgi::DiscreteAction,_std::allocator<pgi::DiscreteAction>_>
                                      ._M_impl.super__Vector_impl_data._M_start + local_1b10),d_01);
            pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1a80,
                       (pgi *)((long)&((decpomdp.jos_.local_.
                                        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->v_).
                                      super__Vector_base<pgi::DiscreteObservation,_std::allocator<pgi::DiscreteObservation>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar20),d_02);
            pgi::print((ostream *)&ss_1,
                       (PolicyGraph *)
                       ((long)&(ptVar2->m_edges).
                               super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next + (long)local_1b30),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1ae0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1a80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1a80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1ae0);
            std::ofstream::~ofstream((string *)&ss_1);
            local_1b08 = local_1b08 + 1;
            local_1b10 = local_1b10 + 0x18;
            local_1b30 = (double)((long)local_1b30 + 0x38);
          }
          std::__cxx11::string::string
                    ((string *)&local_1a80,"output-prefix",(allocator *)&local_1a40);
          paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm)
          ;
          pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
          std::operator+(&local_1ae0,pbVar16,"best_value.txt");
          std::ofstream::ofstream((string *)&ss_1,(string *)&local_1ae0,_S_out);
          std::__cxx11::string::~string((string *)&local_1ae0);
          std::__cxx11::string::~string((string *)&local_1a80);
          poVar18 = std::ostream::_M_insert<double>(dVar4);
          std::endl<char,std::char_traits<char>>(poVar18);
          std::ofstream::~ofstream((string *)&ss_1);
          local_1b30 = dVar4;
        }
        poVar18 = std::operator<<((ostream *)&std::cout,"Step ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)local_1b18);
        poVar18 = std::operator<<(poVar18," of ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,improvement_steps);
        std::operator<<(poVar18,": ");
        poVar18 = std::ostream::_M_insert<double>(bp.improved_policy_value);
        std::operator<<(poVar18," (best: ");
        poVar18 = std::ostream::_M_insert<double>(local_1b30);
        poVar18 = std::operator<<(poVar18,")");
        poVar18 = std::operator<<(poVar18,", ");
        poVar18 = std::ostream::_M_insert<long>((long)poVar18);
        poVar18 = std::operator<<(poVar18," microseconds");
        std::endl<char,std::char_traits<char>>(poVar18);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
        std::__cxx11::string::string((string *)&local_1ae0,"output-prefix",(allocator *)&local_1a80)
        ;
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        poVar18 = std::operator<<((ostream *)&ss_1,(string *)pbVar16);
        poVar18 = std::operator<<(poVar18,"/step");
        *(undefined8 *)(poVar18 + *(long *)(*(long *)poVar18 + -0x18) + 0x10) = 3;
        poVar18 = std::operator<<(poVar18,0x30);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)local_1b18);
        std::operator<<(poVar18,"_");
        std::__cxx11::string::~string((string *)&local_1ae0);
        std::__cxx11::stringbuf::str();
        write_policy_to_file(&jp.locals_,&local_1ae0,&decpomdp);
        std::__cxx11::string::~string((string *)&local_1ae0);
        pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::ensure_size_within_limits(&cache);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_1);
        pgi::JointPolicy::~JointPolicy(&bp.improved_policy);
        iVar5 = (int)local_1b18 + 1;
      }
      std::ofstream::~ofstream(&fs);
      pgi::JointPolicy::~JointPolicy(&jp);
      pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::~TreeCache(&cache);
      std::ofstream::~ofstream(&ftime);
      std::ofstream::~ofstream(&fvalue);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      std::
      vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ::~vector(&local_policy_graphs);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&initial_belief.self_.
                  super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      pgi::DecPOMDPDiscrete::~DecPOMDPDiscrete(&decpomdp);
      if (local_1b28.dpomdp_._M_t.
          super___uniq_ptr_impl<DecPOMDPDiscrete,_std::default_delete<DecPOMDPDiscrete>_>._M_t.
          super__Tuple_impl<0UL,_DecPOMDPDiscrete_*,_std::default_delete<DecPOMDPDiscrete>_>.
          super__Head_base<0UL,_DecPOMDPDiscrete_*,_false>._M_head_impl !=
          (__uniq_ptr_data<DecPOMDPDiscrete,_std::default_delete<DecPOMDPDiscrete>,_true,_true>)0x0)
      {
        (**(code **)(*(long *)local_1b28.dpomdp_._M_t.
                              super___uniq_ptr_impl<DecPOMDPDiscrete,_std::default_delete<DecPOMDPDiscrete>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_DecPOMDPDiscrete_*,_std::default_delete<DecPOMDPDiscrete>_>
                              .super__Head_base<0UL,_DecPOMDPDiscrete_*,_false>._M_head_impl + 8))()
        ;
      }
      iVar5 = 0;
      goto LAB_00175580;
    }
    poVar18 = std::operator<<((ostream *)&std::cout,"You must specify an input dpomdp file");
  }
  std::endl<char,std::char_traits<char>>(poVar18);
  iVar5 = 1;
LAB_00175580:
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&cmdline_options);
  boost::program_options::options_description::~options_description(&hidden);
  boost::program_options::positional_options_description::~positional_options_description(&pp);
  boost::program_options::options_description::~options_description(&config);
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  unsigned int rng_seed;
  unsigned int horizon;
  unsigned int width;
  int improvement_steps;
  std::size_t blind_policy_initial_joint_action;
  std::size_t max_history_cache_size;
  pgi::PolicyInitialization policy_initialization;

  namespace po = boost::program_options;
  po::options_description config("NPGI planner for (Dec)POMDPs \nUsage: " +
                                 std::string(argv[0]) +
                                 " [OPTION]... [DPOMDP-FILE]\nOptions");
  config.add_options()("help", "produce help message")(
      "verbose,v", po::bool_switch()->default_value(false),
      "toggle for verbose output")(
      "horizon,h", po::value<unsigned int>(&horizon)->default_value(3),
      "problem horizon")("policy-width,w",
                         po::value<unsigned int>(&width)->default_value(3),
                         "policy width")(
      "policy-initialization,p",
      po::value<pgi::PolicyInitialization>(&policy_initialization)
          ->default_value(pgi::PolicyInitialization::random),
      "policy initialization type: (random | greedy | blind)")(
      "blind-action,b",
      po::value<std::size_t>(&blind_policy_initial_joint_action)
          ->default_value(0),
      "action for blind policy initialization")(
      "improvement-steps,i",
      po::value<int>(&improvement_steps)->default_value(9),
      "number of policy improvement steps")(
      "use-lower-bound,l", po::bool_switch()->default_value(false),
      "toggle to use lower bound")(
      "use-entropy-reward,e", po::bool_switch()->default_value(false),
      "toggle to use expected posterior entropy as final step reward")(
      "use-sparse,t", po::bool_switch()->default_value(false),
      "toggle to use sparse")(
      "seed,s", po::value<unsigned int>(&rng_seed)->default_value(1234567890),
      "random number seed")("output-prefix,o",
                            po::value<std::string>()->default_value("./"),
                            "output prefix")(
      "max-cache-size,m",
      po::value<std::size_t>(&max_history_cache_size)->default_value(5e7),
      "maximum history cache size");

  po::positional_options_description pp;
  pp.add("dpomdp-file", -1);

  po::options_description hidden("Hidden options");
  hidden.add_options()("dpomdp-file", po::value<std::string>(), "input file");

  po::options_description cmdline_options;
  cmdline_options.add(config).add(hidden);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv)
                .options(cmdline_options)
                .positional(pp)
                .run(),
            vm);
  po::notify(vm);
  if (vm.count("help") || argc == 1) {
    std::cout << config << std::endl;
    return 1;
  }
  if (!vm.count("dpomdp-file")) {
    std::cout << "You must specify an input dpomdp file" << std::endl;
    return 1;
  }

  pgi::madpwrapper::MADPDecPOMDPDiscrete madp(
      vm["dpomdp-file"].as<std::string>());
  if (vm["verbose"].as<bool>())
    std::cout << "Loaded problem file " << vm["dpomdp-file"].as<std::string>()
              << std::endl;

  pgi::DecPOMDPDiscrete decpomdp(
      pgi::make_state_space(madp), pgi::make_joint_action_space(madp),
      pgi::make_joint_observation_space(madp),
      pgi::make_transition_matrix(madp, vm["use-sparse"].as<bool>()),
      pgi::make_observation_matrix(madp, vm["use-sparse"].as<bool>()),
      pgi::make_reward_matrix(madp, vm["use-entropy-reward"].as<bool>()));

  pgi::belief_t initial_belief =
      pgi::make_initial_belief(madp, vm["use-sparse"].as<bool>());

  pgi::PRNG rng(rng_seed);

  std::vector<pgi::PolicyGraph> local_policy_graphs;
  const pgi::JointActionSpace& jas = decpomdp.joint_action_space();
  const pgi::JointObservationSpace& jos = decpomdp.joint_observation_space();
  for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
    local_policy_graphs.emplace_back(pgi::fixed_width(
        vm["horizon"].as<unsigned int>(), width, jas.num_local_indices(agent),
        jos.num_local_indices(agent)));
  }

  if (policy_initialization == pgi::PolicyInitialization::random) {
    pgi::set_random(local_policy_graphs, rng);
  } else if (policy_initialization == pgi::PolicyInitialization::greedy) {
    pgi::set_open_loop_greedy(local_policy_graphs, initial_belief, decpomdp);
  } else if (policy_initialization == pgi::PolicyInitialization::blind) {
    pgi::set_random(local_policy_graphs,
                    rng);  // to randomize the edges in the policy
    pgi::set_blind(local_policy_graphs, blind_policy_initial_joint_action,
                   decpomdp.joint_action_space());
  }

  if (vm["verbose"].as<bool>())
    std::cout << "Initialized policy using " << policy_initialization
              << " strategy" << std::endl;

  std::ostringstream ss;
  ss << vm["output-prefix"].as<std::string>() << "step" << std::setw(3)
     << std::setfill('0') << 0 << "_";
  write_policy_to_file(local_policy_graphs, ss.str(), decpomdp);

  std::ofstream fvalue(vm["output-prefix"].as<std::string>() +
                       "policy_values.txt");
  std::ofstream ftime(vm["output-prefix"].as<std::string>() +
                      "duration_microseconds.txt");

  pgi::HistoryCache cache(pgi::HistoryData{1.0, 0.0, 0.0, std::move(initial_belief)}, max_history_cache_size);
  pgi::JointPolicy jp(local_policy_graphs);
  double best_value = pgi::value(jp, jp.root(), pgi::History(), decpomdp, cache);
  fvalue << best_value << std::endl;
  std::cout << "Policy value: " << best_value << std::endl;
  std::cout << "Stored " << cache.size() << " histories in cache"
            << std::endl;

  // write initial best policy and value
  for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
    std::ofstream fs(vm["output-prefix"].as<std::string>() +
                     "best_policy_agent" + std::to_string(agent) + ".dot");
    print(fs, jp.local_policy(agent),
          pgi::element_names(decpomdp.joint_action_space().get(agent)),
          pgi::element_names(decpomdp.joint_observation_space().get(agent)));
  }

  std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
  fs << best_value << std::endl;

  for (int i = 1; i <= improvement_steps; ++i) {
    std::chrono::high_resolution_clock::time_point t1 =
        std::chrono::high_resolution_clock::now();
    pgi::backpass::BackPassProperties backprops(
        vm["use-lower-bound"].as<bool>());
    auto bp = pgi::backpass::improve(jp, decpomdp, cache, rng, backprops);
    std::chrono::high_resolution_clock::time_point t3 =
        std::chrono::high_resolution_clock::now();
    auto duration =
        std::chrono::duration_cast<std::chrono::microseconds>(t3 - t1).count();
    ftime << duration << std::endl;


    fvalue << bp.improved_policy_value << std::endl;

    if (bp.improved_policy_value > best_value) {
      best_value = bp.improved_policy_value;
      jp = bp.improved_policy;

      // update best policy and value!
      for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
        std::ofstream fs(vm["output-prefix"].as<std::string>() +
                         "best_policy_agent" + std::to_string(agent) + ".dot");
        print(fs, jp.local_policy(agent),
              pgi::element_names(decpomdp.joint_action_space().get(agent)),
              pgi::element_names(decpomdp.joint_observation_space().get(agent)));
      }

      std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
      fs << best_value << std::endl;
    }

    std::cout << "Step " << i << " of " << improvement_steps << ": "
              << bp.improved_policy_value << " (best: " << best_value << ")"
              << ", " << duration << " microseconds" << std::endl;

    std::ostringstream ss;
    ss << vm["output-prefix"].as<std::string>() << "/step" << std::setw(3)
       << std::setfill('0') << i << "_";
    write_policy_to_file(jp.local_policies(), ss.str(), decpomdp);

    cache.ensure_size_within_limits();
  }

  return 0;
}